

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

TcpSocket * __thiscall TcpServerImpl::MakeClientConnection(TcpServerImpl *this,int32_t *fSock)

{
  BaseSocket *pBVar1;
  int iVar2;
  BaseSocket *pBVar3;
  BaseSocketImpl *pBVar4;
  TcpSocketImpl *this_00;
  TcpServer *pTVar5;
  pointer *__ptr;
  _Head_base<0UL,_BaseSocket_*,_false> local_48;
  thread local_40;
  code *local_38;
  undefined8 local_30;
  TcpSocketImpl *local_28;
  
  pBVar3 = (BaseSocket *)operator_new(0x10);
  TcpSocket::TcpSocket((TcpSocket *)pBVar3);
  this_00 = (TcpSocketImpl *)0x0;
  local_48._M_head_impl = pBVar3;
  pBVar3 = (BaseSocket *)__dynamic_cast(pBVar3,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
  pBVar4 = BaseSocket::GetImpl(pBVar3);
  if (pBVar4 != (BaseSocketImpl *)0x0) {
    this_00 = (TcpSocketImpl *)
              __dynamic_cast(pBVar4,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  (this_00->super_BaseSocketImpl).m_fSock = *fSock;
  LOCK();
  (this_00->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>._M_i = '\a';
  UNLOCK();
  pBVar1 = (this->super_BaseSocketImpl).m_pBkRef;
  if (pBVar1 == (BaseSocket *)0x0) {
    pTVar5 = (TcpServer *)0x0;
  }
  else {
    pTVar5 = (TcpServer *)__dynamic_cast(pBVar1,&BaseSocket::typeinfo,&TcpServer::typeinfo,0);
  }
  this_00->m_pRefServSocket = pTVar5;
  local_38 = TcpSocketImpl::WriteThread;
  local_30 = 0;
  pBVar4 = BaseSocket::GetImpl(pBVar3);
  if (pBVar4 == (BaseSocketImpl *)0x0) {
    local_28 = (TcpSocketImpl *)0x0;
  }
  else {
    local_28 = (TcpSocketImpl *)
               __dynamic_cast(pBVar4,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
            (&local_40,(offset_in_TcpSocketImpl_to_subr *)&local_38,&local_28);
  if ((this_00->super_BaseSocketImpl).m_thWrite._M_id._M_thread == 0) {
    (this_00->super_BaseSocketImpl).m_thWrite._M_id._M_thread =
         (native_handle_type)local_40._M_id._M_thread;
    (*(this_00->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])(this_00,fSock);
    TcpSocketImpl::GetConnectionInfo(this_00);
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&BaseSocketImpl::s_mxClientSocket);
    if (iVar2 == 0) {
      std::
      deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
      ::emplace_back<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>
                ((deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
                  *)&BaseSocketImpl::s_lstClientSocket,
                 (unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> *)&local_48);
      pthread_mutex_unlock((pthread_mutex_t *)&BaseSocketImpl::s_mxClientSocket);
      if (local_48._M_head_impl != (BaseSocket *)0x0) {
        (*((BaseSocket *)&(local_48._M_head_impl)->_vptr_BaseSocket)->_vptr_BaseSocket[1])();
      }
      return (TcpSocket *)pBVar3;
    }
    std::__throw_system_error(iVar2);
  }
  std::terminate();
}

Assistant:

TcpSocket* TcpServerImpl::MakeClientConnection(const SOCKET& fSock)
{
    unique_ptr<BaseSocket> pTcpSocket = make_unique<TcpSocket>();
    TcpSocket* pTcpSock = dynamic_cast<TcpSocket*>(pTcpSocket.get());
    TcpSocketImpl* pTcpSocketImpl = dynamic_cast<TcpSocketImpl*>(pTcpSock->GetImpl());

    try
    {
        pTcpSocketImpl->m_fSock = fSock;
        pTcpSocketImpl->m_iShutDownState = 7;
        pTcpSocketImpl->m_pRefServSocket = dynamic_cast<TcpServer*>(m_pBkRef);
        pTcpSocketImpl->m_thWrite = thread(&TcpSocketImpl::WriteThread, dynamic_cast<TcpSocketImpl*>(pTcpSock->GetImpl()));

        pTcpSocketImpl->SetSocketOption(fSock);
        pTcpSocketImpl->GetConnectionInfo();
    }

    catch (const int iErrNo)
    {
        pTcpSocketImpl->SetErrorNo(iErrNo);
    }

    lock_guard<mutex> lock(s_mxClientSocket);
    s_lstClientSocket.push_back(move(pTcpSocket));

    return pTcpSock;
}